

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong uVar1;
  string *psVar2;
  string *psVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong local_30;
  size_t i;
  string *psStack_20;
  bool replaced;
  string *withThis_local;
  string *replaceThis_local;
  string *str_local;
  
  i._7_1_ = 0;
  psStack_20 = withThis;
  withThis_local = replaceThis;
  replaceThis_local = str;
  local_30 = std::__cxx11::string::find((string *)str,(ulong)replaceThis);
  while (local_30 != 0xffffffffffffffff) {
    i._7_1_ = 1;
    std::__cxx11::string::substr((ulong)&local_90,(ulong)replaceThis_local);
    std::operator+(&local_70,&local_90,psStack_20);
    psVar2 = replaceThis_local;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)psVar2);
    std::operator+(&local_50,&local_70,&local_c0);
    std::__cxx11::string::operator=((string *)replaceThis_local,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    uVar1 = local_30;
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    psVar3 = replaceThis_local;
    psVar2 = withThis_local;
    if (uVar1 < (ulong)(lVar4 - lVar5)) {
      std::__cxx11::string::size();
      local_30 = std::__cxx11::string::find((string *)psVar3,(ulong)psVar2);
    }
    else {
      local_30 = 0xffffffffffffffff;
    }
  }
  return (bool)(i._7_1_ & 1);
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }